

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O2

char * mpack_node_str(mpack_node_t node)

{
  mpack_tree_t *tree;
  
  tree = node.tree;
  if (tree->error != mpack_ok) {
    return (char *)0x0;
  }
  if ((node.data)->type == mpack_type_str) {
    return tree->data + (long)((node.data)->value).children;
  }
  mpack_tree_flag_error(tree,mpack_error_type);
  return (char *)0x0;
}

Assistant:

MPACK_INLINE const char* mpack_node_str(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return NULL;

    mpack_type_t type = node.data->type;
    if (type == mpack_type_str)
        return mpack_node_data_unchecked(node);

    mpack_node_flag_error(node, mpack_error_type);
    return NULL;
}